

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha_filename.c
# Opt level: O0

void test_read_format_lha_filename(void)

{
  char *refname;
  
  extract_reference_file("test_read_format_lha_filename_cp932.lzh");
  test_read_format_lha_filename_CP932_eucJP("test_read_format_lha_filename_cp932.lzh");
  test_read_format_lha_filename_CP932_UTF8("test_read_format_lha_filename_cp932.lzh");
  test_read_format_lha_filename_CP932_Windows("test_read_format_lha_filename_cp932.lzh");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_lha_filename)
{
	/* A sample file was created with LHA32.EXE through UNLHA.DLL. */
	const char *refname = "test_read_format_lha_filename_cp932.lzh";

	extract_reference_file(refname);

	test_read_format_lha_filename_CP932_eucJP(refname);
	test_read_format_lha_filename_CP932_UTF8(refname);
	test_read_format_lha_filename_CP932_Windows(refname);
}